

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  RefI31 *pRVar1;
  Builder local_20;
  Expression *local_18;
  BinaryenExpressionRef value_local;
  BinaryenModuleRef module_local;
  
  local_18 = value;
  value_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_20,module);
  pRVar1 = wasm::Builder::makeRefI31(&local_20,local_18,Unshared);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefI31((Expression*)value));
}